

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcut.cc
# Opt level: O1

void anon_unknown.dwarf_c010::PrintUsage(ostream *stream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char cVar3;
  ostream *poVar4;
  string local_48;
  
  cVar3 = (char)stream;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream," bcut - binary file cut",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  usage:",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       bcut [ options ] [ infile ] > stdout",0x2b);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  options:",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -s s  : start number       (   int)[",0x2b);
  lVar2 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)stream,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"][ 0 <= s <= e ]",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -e e  : end number         (   int)[",0x2b);
  lVar2 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"EOF",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"][ s <= e <=   ]",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -l l  : block length       (   int)[",0x2b);
  lVar2 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)stream,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"][ 1 <= l <=   ]",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -m m  : block order        (   int)[",0x2b);
  lVar2 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"l-1",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"][ 0 <= m <=   ]",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       +type : data type                  [",0x2b);
  lVar2 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"d",1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"c","");
  sptk::PrintDataType(&local_48,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"C","");
  sptk::PrintDataType(&local_48,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"s","");
  sptk::PrintDataType(&local_48,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"S","");
  sptk::PrintDataType(&local_48,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"h","");
  sptk::PrintDataType(&local_48,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"H","");
  sptk::PrintDataType(&local_48,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"i","");
  sptk::PrintDataType(&local_48,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"I","");
  sptk::PrintDataType(&local_48,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"l","");
  sptk::PrintDataType(&local_48,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"L","");
  sptk::PrintDataType(&local_48,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"f","");
  sptk::PrintDataType(&local_48,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"d","");
  sptk::PrintDataType(&local_48,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"e","");
  sptk::PrintDataType(&local_48,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -h    : print this message",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  infile:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       data sequence              (  type)[stdin]",0x31);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  stdout:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       cut data sequence          (  type)",0x2a);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream," SPTK: version ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"4.3",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " bcut - binary file cut" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       bcut [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -s s  : start number       (   int)[" << std::setw(5) << std::right << kDefaultStartNumber << "][ 0 <= s <= e ]" << std::endl;  // NOLINT
  *stream << "       -e e  : end number         (   int)[" << std::setw(5) << std::right << "EOF"               << "][ s <= e <=   ]" << std::endl;  // NOLINT
  *stream << "       -l l  : block length       (   int)[" << std::setw(5) << std::right << kDefaultBlockLength << "][ 1 <= l <=   ]" << std::endl;  // NOLINT
  *stream << "       -m m  : block order        (   int)[" << std::setw(5) << std::right << "l-1"               << "][ 0 <= m <=   ]" << std::endl;  // NOLINT
  *stream << "       +type : data type                  [" << std::setw(5) << std::right << kDefaultDataType    << "]" << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("c", stream); sptk::PrintDataType("C", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("s", stream); sptk::PrintDataType("S", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("h", stream); sptk::PrintDataType("H", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("i", stream); sptk::PrintDataType("I", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("l", stream); sptk::PrintDataType("L", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("f", stream); sptk::PrintDataType("d", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("e", stream);                                   *stream << std::endl;  // NOLINT
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       data sequence              (  type)[stdin]" << std::endl;
  *stream << "  stdout:" << std::endl;
  *stream << "       cut data sequence          (  type)" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}